

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

void pcp_flow_set_flowp(pcp_flow_t *f,uint8_t dscp_up,uint8_t dscp_down)

{
  bool local_22;
  pcp_flow_s *ppStack_20;
  uint8_t fpresent;
  pcp_flow_t *fiter;
  uint8_t dscp_down_local;
  uint8_t dscp_up_local;
  pcp_flow_t *f_local;
  
  for (ppStack_20 = f; ppStack_20 != (pcp_flow_t *)0x0; ppStack_20 = ppStack_20->next_child) {
    local_22 = dscp_up != '\0' || dscp_down != '\0';
    if ((bool)ppStack_20->flowp_option_present != local_22) {
      ppStack_20->flowp_option_present = local_22;
    }
    if (dscp_up != '\0' || dscp_down != '\0') {
      ppStack_20->flowp_dscp_up = dscp_up;
      ppStack_20->flowp_dscp_down = dscp_down;
    }
    pcp_flow_updated(ppStack_20);
  }
  return;
}

Assistant:

void pcp_flow_set_flowp(pcp_flow_t *f, uint8_t dscp_up, uint8_t dscp_down) {
    pcp_flow_t *fiter;

    for (fiter = f; fiter; fiter = fiter->next_child) {
        uint8_t fpresent = (dscp_up != 0) || (dscp_down != 0);
        if (fiter->flowp_option_present != fpresent) {
            fiter->flowp_option_present = fpresent;
        }
        if (fpresent) {
            fiter->flowp_dscp_up = dscp_up;
            fiter->flowp_dscp_down = dscp_down;
        }
        pcp_flow_updated(fiter);
    }
}